

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *pPVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  ResponseHook *pRVar4;
  MallocMessageBuilder *pMVar5;
  
  pPVar1 = (this->tailCallPipelineFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    (this->tailCallPipelineFulfiller).ptr.ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0
    ;
    pDVar2 = (this->tailCallPipelineFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
  }
  pCVar3 = (this->clientRef).ptr;
  if (pCVar3 != (ClientHook *)0x0) {
    (this->clientRef).ptr = (ClientHook *)0x0;
    pDVar2 = (this->clientRef).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  if (((this->response).ptr.isSet == true) &&
     (pRVar4 = (this->response).ptr.field_1.value.hook.ptr, pRVar4 != (ResponseHook *)0x0)) {
    (this->response).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    pDVar2 = (this->response).ptr.field_1.value.hook.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pRVar4->_vptr_ResponseHook[-2] + (long)&pRVar4->_vptr_ResponseHook);
  }
  pMVar5 = (this->request).ptr.ptr;
  if (pMVar5 != (MallocMessageBuilder *)0x0) {
    (this->request).ptr.ptr = (MallocMessageBuilder *)0x0;
    pDVar2 = (this->request).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(code *)((long)(pMVar5->super_MessageBuilder).arenaSpace +
                              (long)((pMVar5->super_MessageBuilder)._vptr_MessageBuilder[-2] + -8)))
    ;
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public ResponseHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   ClientHook::CallHints hints, bool isStreaming)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)), hints(hints),
        isStreaming(isStreaming) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_SOME(r, request) {
      return r.get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = kj::none;
  }